

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

DOHcode cnameappend(cnamestore *c,uchar *src,size_t len)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  
  pcVar1 = c->alloc;
  if (pcVar1 == (char *)0x0) {
    c->allocsize = len + 1;
    pcVar1 = (char *)(*Curl_cmalloc)(len + 1);
    c->alloc = pcVar1;
    if (pcVar1 == (char *)0x0) {
      return DOH_OUT_OF_MEM;
    }
  }
  else {
    uVar3 = len + c->allocsize + 1;
    if (c->allocsize < uVar3) {
      c->allocsize = uVar3;
      pcVar1 = (char *)(*Curl_crealloc)(pcVar1,uVar3);
      if (pcVar1 == (char *)0x0) {
        (*Curl_cfree)(c->alloc);
        return DOH_OUT_OF_MEM;
      }
      c->alloc = pcVar1;
    }
  }
  memcpy(pcVar1 + c->len,src,len);
  sVar2 = len + c->len;
  c->len = sVar2;
  c->alloc[sVar2] = '\0';
  return DOH_OK;
}

Assistant:

static DOHcode cnameappend(struct cnamestore *c,
                           unsigned char *src,
                           size_t len)
{
  if(!c->alloc) {
    c->allocsize = len + 1;
    c->alloc = malloc(c->allocsize);
    if(!c->alloc)
      return DOH_OUT_OF_MEM;
  }
  else if(c->allocsize < (c->allocsize + len + 1)) {
    char *ptr;
    c->allocsize += len + 1;
    ptr = realloc(c->alloc, c->allocsize);
    if(!ptr) {
      free(c->alloc);
      return DOH_OUT_OF_MEM;
    }
    c->alloc = ptr;
  }
  memcpy(&c->alloc[c->len], src, len);
  c->len += len;
  c->alloc[c->len] = 0; /* keep it zero terminated */
  return DOH_OK;
}